

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O0

void __thiscall
CVmImageLoader::load_mres(CVmImageLoader *this,ulong siz,CVmImageLoaderMres *res_ifc)

{
  unsigned_long uVar1;
  long *in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  size_t rem;
  char *p;
  char name_buf [256];
  uint entry_name_len;
  uint32_t entry_size;
  uint32_t entry_ofs;
  uint i;
  long base_ofs;
  uint entry_cnt;
  char buf [16];
  ulong *in_stack_fffffffffffffe98;
  char *in_stack_fffffffffffffea8;
  CVmImageLoader *in_stack_fffffffffffffeb0;
  CVmImageLoader local_148;
  uint local_48;
  undefined4 local_44;
  int local_40;
  uint local_3c;
  long local_38;
  uint local_2c;
  undefined1 local_28 [4];
  undefined1 auStack_24 [4];
  byte local_20;
  long *local_18;
  long local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_38 = (**(code **)(*(long *)*in_RDI + 0x40))();
  local_38 = local_38 + in_RDI[3];
  read_data(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,(size_t)in_RDI,
            in_stack_fffffffffffffe98);
  local_2c = ::osrp2(local_28);
  for (local_3c = 0; local_3c < local_2c; local_3c = local_3c + 1) {
    read_data(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,(size_t)in_RDI,
              in_stack_fffffffffffffe98);
    uVar1 = ::osrp4(local_28);
    local_40 = (int)uVar1;
    uVar1 = ::osrp4(auStack_24);
    local_44 = (undefined4)uVar1;
    local_48 = (uint)local_20;
    read_data(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,(size_t)in_RDI,
              in_stack_fffffffffffffe98);
    local_148.timestamp_[(ulong)local_48 - 0x24] = '\0';
    in_stack_fffffffffffffeb0 = &local_148;
    for (in_stack_fffffffffffffea8 = (char *)(ulong)local_48;
        in_stack_fffffffffffffea8 != (char *)0x0;
        in_stack_fffffffffffffea8 = in_stack_fffffffffffffea8 + -1) {
      *(byte *)&in_stack_fffffffffffffeb0->fp_ = *(byte *)&in_stack_fffffffffffffeb0->fp_ ^ 0xff;
      in_stack_fffffffffffffeb0 = (CVmImageLoader *)((long)&in_stack_fffffffffffffeb0->fp_ + 1);
    }
    (**(code **)(*local_18 + 0x10))(local_18,(int)local_38 + local_40,local_44,&local_148,local_48);
  }
  if (local_10 != 0) {
    (**(code **)(*(long *)*in_RDI + 0x48))((long *)*in_RDI,local_10);
  }
  return;
}

Assistant:

void CVmImageLoader::load_mres(ulong siz, CVmImageLoaderMres *res_ifc)
{
    char buf[16];
    uint entry_cnt;
    long base_ofs;
    uint i;

    /* 
     *   Note the current physical seek position - each entry's seek position
     *   is stored in the table of contents as an offset from this location.
     *   
     *   Compute the physical base offset: this is the logical base offset in
     *   our image stream, plus the offset of the image stream within the
     *   image file.  We need the physical base offset because the underlying
     *   interpreter's resource loader works with the physical file, not the
     *   logical image stream.  
     */
    base_ofs = fp_->get_seek() + base_seek_ofs_;
    
    /* read the entry count and size of the table of contents */
    read_data(buf, 2, &siz);
    entry_cnt = osrp2(buf);

    /* read the entries */
    for (i = 0 ; i < entry_cnt ; ++i)
    {
        uint32_t entry_ofs;
        uint32_t entry_size;
        uint entry_name_len;
        char name_buf[256];
        char *p;
        size_t rem;

        /* read the fixed part of the table-of-contents entry */
        read_data(buf, 9, &siz);
        entry_ofs = t3rp4u(buf);
        entry_size = t3rp4u(buf + 4);
        entry_name_len = (uchar)*(buf + 8);

        /* read the name */
        read_data(name_buf, entry_name_len, &siz);

        /* null-terminate the name */
        name_buf[entry_name_len] = '\0';

        /* XOR the bytes of the name with 0xFF */
        for (p = name_buf, rem = entry_name_len ; rem != 0 ; ++p, --rem)
             *p ^= 0xFF;

        /* add the resource to the resource interface */
        res_ifc->add_resource(base_ofs + entry_ofs, entry_size,
                              name_buf, entry_name_len);
    }

    /* 
     *   skip the data portion of the block, since we now have a map of
     *   the data and can load individual resources on demand 
     */
    if (siz != 0)
        fp_->skip_ahead(siz);
}